

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ImportBaseFuncWrapper::getName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  qsizetype qVar1;
  QString local_a0;
  QString local_88;
  QString local_70;
  undefined4 local_58;
  undefined1 local_48 [8];
  QString functionName;
  QString libName;
  ImportBaseFuncWrapper *this_local;
  
  getLibName((QString *)&functionName.d.size,this);
  getShortName((QString *)local_48,this);
  qVar1 = QString::length((QString *)&functionName.d.size);
  if (qVar1 == 0) {
    QString::QString(__return_storage_ptr__,(QString *)local_48);
  }
  else {
    QString::QString(&local_a0,(QString *)&functionName.d.size);
    operator+(&local_88,"[",&local_a0);
    operator+(&local_70,&local_88,"].");
    operator+(__return_storage_ptr__,&local_70,(QString *)local_48);
    QString::~QString(&local_70);
    QString::~QString(&local_88);
    QString::~QString(&local_a0);
  }
  local_58 = 1;
  QString::~QString((QString *)local_48);
  QString::~QString((QString *)&functionName.d.size);
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getName()
{
    QString libName = getLibName();
    QString functionName = getShortName();

    if (!libName.length()) return functionName;

    return "[" + QString(libName) + "]." + functionName;
}